

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall spirv_cross::Compiler::is_tessellating_triangles(Compiler *this)

{
  SPIREntryPoint *pSVar1;
  
  pSVar1 = get_entry_point(this);
  return (bool)((*(byte *)((long)&(pSVar1->flags).lower + 2) & 0x40) >> 6);
}

Assistant:

bool Compiler::is_tessellating_triangles() const
{
	return get_execution_mode_bitset().get(ExecutionModeTriangles);
}